

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

bool __thiscall
t_php_generator::needs_php_write_validator(t_php_generator *this,t_struct *tstruct,bool is_result)

{
  int iVar1;
  
  if ((this->validate_ == true && !is_result) && (tstruct->is_union_ == false)) {
    iVar1 = get_php_num_required_fields(this,&tstruct->members_,true);
    return 0 < iVar1;
  }
  return false;
}

Assistant:

bool t_php_generator::needs_php_write_validator(t_struct* tstruct, bool is_result) {
  return (validate_ && !is_result && !tstruct->is_union()
          && get_php_num_required_fields(tstruct->get_members(), true) > 0);
}